

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O2

void de::cmdline::parseType<int>(char *src,int *dst)

{
  invalid_argument *this;
  allocator<char> local_1b1;
  string local_1b0 [32];
  istringstream str;
  uint auStack_170 [88];
  
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,src,&local_1b1);
  std::__cxx11::istringstream::istringstream((istringstream *)&str,local_1b0,_S_in);
  std::__cxx11::string::~string(local_1b0);
  std::istream::operator>>((istream *)&str,dst);
  if ((*(uint *)((long)auStack_170 + *(long *)(_str + -0x18)) & 3) == 2) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&str);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"invalid integer literal");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void parseType<int> (const char* src, int* dst)
{
	std::istringstream str(src);
	str >> *dst;
	if (str.bad() || !str.eof())
		throw std::invalid_argument("invalid integer literal");
}